

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_key2ms.c
# Opt level: O0

int key2pvk_set_ctx_params(void *vctx,OSSL_PARAM *params)

{
  int iVar1;
  OSSL_PARAM *val;
  OSSL_PARAM *in_RDI;
  OSSL_PARAM *p;
  key2ms_ctx_st *ctx;
  char *in_stack_ffffffffffffffd8;
  
  val = OSSL_PARAM_locate_const(in_RDI,in_stack_ffffffffffffffd8);
  if ((val != (OSSL_PARAM *)0x0) && (iVar1 = OSSL_PARAM_get_int(in_RDI,(int *)val), iVar1 == 0)) {
    return 0;
  }
  return 1;
}

Assistant:

static int key2pvk_set_ctx_params(void *vctx, const OSSL_PARAM params[])
{
    struct key2ms_ctx_st *ctx = vctx;
    const OSSL_PARAM *p;

    p = OSSL_PARAM_locate_const(params, OSSL_ENCODER_PARAM_ENCRYPT_LEVEL);
    if (p != NULL && !OSSL_PARAM_get_int(p, &ctx->pvk_encr_level))
        return 0;
    return 1;
}